

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

void mdb_dpage_free(MDB_env *env,MDB_page *dp)

{
  MDB_page *dp_local;
  MDB_env *env_local;
  
  if (((dp->mp_flags & 4) == 4) && ((dp->mp_pb).pb_pages != 1)) {
    free(dp);
  }
  else {
    mdb_page_free(env,dp);
  }
  return;
}

Assistant:

static void
mdb_dpage_free(MDB_env *env, MDB_page *dp)
{
	if (!IS_OVERFLOW(dp) || dp->mp_pages == 1) {
		mdb_page_free(env, dp);
	} else {
		/* large pages just get freed directly */
		VGMEMP_FREE(env, dp);
		free(dp);
	}
}